

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FilterOperations.cpp
# Opt level: O2

void __thiscall
helics::RerouteFilterOperation::setString
          (RerouteFilterOperation *this,string_view property,string_view val)

{
  bool bVar1;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_00;
  string_view val_local;
  handle cond;
  regex test;
  
  __y._M_str = "newdestination";
  __y._M_len = 0xe;
  val_local._M_len = val._M_len;
  val_local._M_str = val._M_str;
  bVar1 = std::operator==((basic_string_view<char,_std::char_traits<char>_>)property,__y);
  if (bVar1) {
    gmlc::libguarded::atomic_guarded<std::__cxx11::string,std::mutex>::operator=
              ((atomic_guarded<std::__cxx11::string,std::mutex> *)&this->newDest,&val_local);
  }
  else {
    __y_00._M_str = "condition";
    __y_00._M_len = 9;
    bVar1 = std::operator==((basic_string_view<char,_std::char_traits<char>_>)property,__y_00);
    if (bVar1) {
      std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::basic_regex
                (&test,val._M_str,val._M_len,0x10);
      gmlc::libguarded::
      shared_guarded<std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::shared_mutex>
      ::lock(&cond,&this->conditions);
      std::
      _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
      ::_M_emplace_unique<std::basic_string_view<char,std::char_traits<char>>&>
                ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                  *)cond.data,&val_local);
      std::unique_lock<std::shared_mutex>::~unique_lock(&cond.m_handle_lock);
      CLI::std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::~basic_regex
                ((basic_regex<char,_std::__cxx11::regex_traits<char>_> *)&test);
    }
  }
  return;
}

Assistant:

void RerouteFilterOperation::setString(std::string_view property, std::string_view val)
{
    if (property == "newdestination") {
        newDest = val;
    } else if (property == "condition") {
        try {
            // this line is to verify that it is a valid regex
            auto test = std::regex(val.data(), val.size());
            auto cond = conditions.lock();
            cond->emplace(val);
        }
        catch (const std::regex_error& re) {
            std::cerr << "filter expression is not a valid Regular expression " << re.what()
                      << '\n';
            throw(helics::InvalidParameter(
                std::string("filter expression is not a valid Regular expression ") + re.what()));
        }
    }
}